

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
MutatorsIRCCommand::trigger
          (MutatorsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  char cVar4;
  long lVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_t sVar10;
  uint uVar11;
  undefined8 *puVar12;
  string list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  IRC_Bot *local_90;
  undefined4 local_84;
  size_t local_80;
  char *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar8 = channel._M_str;
  sVar10 = channel._M_len;
  local_90 = source;
  lVar5 = Jupiter::IRC::Client::getChannel(source,sVar10,pcVar8,pcVar8,nick._M_len,nick._M_str);
  if (lVar5 != 0) {
    local_84 = Jupiter::IRC::Client::Channel::getType();
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_b0.field_2;
    uVar11 = 0;
    local_80 = sVar10;
    local_78 = pcVar8;
    while( true ) {
      RenX::getCore();
      uVar6 = RenX::Core::getServerCount();
      if (uVar6 == uVar11) break;
      uVar6 = RenX::getCore();
      lVar5 = RenX::Core::getServer(uVar6);
      cVar4 = RenX::Server::isLogChanType((int)lVar5);
      if (cVar4 != '\0') {
        local_b0.field_2._8_6_ = 0xf5d73726f74;
        local_b0.field_2._M_allocated_capacity._0_6_ = 0x754d5b333003;
        local_b0.field_2._M_allocated_capacity._6_2_ = 0x6174;
        local_b0._M_string_length = 0xe;
        local_b0.field_2._M_local_buf[0xe] = '\0';
        local_b0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_70,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,
                          CONCAT26(local_b0.field_2._M_allocated_capacity._6_2_,
                                   local_b0.field_2._M_allocated_capacity._0_6_) + 1);
        }
        puVar12 = *(undefined8 **)(lVar5 + 0x40);
        puVar2 = *(undefined8 **)(lVar5 + 0x48);
        if (puVar12 != puVar2) {
          do {
            local_50.field_2._M_allocated_capacity._0_2_ = 0x20;
            local_50._M_string_length = 1;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append(&local_50,(char *)*puVar12,puVar12[1]);
            local_b0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar9 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p == paVar9) {
              uVar3 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_b0.field_2._M_allocated_capacity._0_6_ =
                   (undefined6)paVar9->_M_allocated_capacity;
              local_b0.field_2._M_allocated_capacity._6_2_ =
                   (undefined2)(paVar9->_M_allocated_capacity >> 0x30);
              local_b0.field_2._8_6_ = (undefined6)uVar3;
              local_b0.field_2._M_local_buf[0xe] = (char)((ulong)uVar3 >> 0x30);
              local_b0.field_2._M_local_buf[0xf] = (char)((ulong)uVar3 >> 0x38);
              local_b0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_b0.field_2._M_allocated_capacity._0_6_ =
                   (undefined6)paVar9->_M_allocated_capacity;
              local_b0.field_2._M_allocated_capacity._6_2_ =
                   (undefined2)(paVar9->_M_allocated_capacity >> 0x30);
            }
            local_b0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_70,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar1) {
              operator_delete(local_b0._M_dataplus._M_p,
                              CONCAT26(local_b0.field_2._M_allocated_capacity._6_2_,
                                       local_b0.field_2._M_allocated_capacity._0_6_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,
                              CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                                       local_50.field_2._M_allocated_capacity._0_2_) + 1);
            }
            pcVar8 = local_78;
            sVar10 = local_80;
            puVar12 = puVar12 + 4;
          } while (puVar12 != puVar2);
          if (*(long *)(lVar5 + 0x40) != *(long *)(lVar5 + 0x48)) {
            Jupiter::IRC::Client::sendMessage
                      (local_90,local_80,local_78,local_70._M_string_length,
                       local_70._M_dataplus._M_p);
            goto LAB_00126964;
          }
        }
        pcVar8 = local_78;
        sVar10 = local_80;
        Jupiter::IRC::Client::sendMessage(local_90,local_80,local_78,0x12,"No mutators loaded");
      }
LAB_00126964:
      uVar11 = uVar11 + 1;
    }
    if (local_70._M_string_length == 0) {
      Jupiter::IRC::Client::sendMessage
                (local_90,sVar10,pcVar8,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void MutatorsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		std::string list;
		size_t index = 0;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				list = IRCCOLOR "03[Mutators]"s IRCNORMAL;
				for (const auto& mutator : server->mutators) {
					list += " "s + mutator;
				}

				if (server->mutators.empty()) {
					source->sendMessage(channel, "No mutators loaded"sv);
				}
				else {
					source->sendMessage(channel, list);
				}
			}
		}
		if (list.empty())
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}